

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calculator08buggy.cpp
# Opt level: O2

double term(void)

{
  bool bVar1;
  double dVar2;
  Token t;
  allocator<char> local_c9;
  double local_c8;
  double local_c0;
  double local_b8;
  string local_b0;
  undefined1 local_90 [48];
  undefined1 local_60 [48];
  
  local_c8 = primary();
  do {
    Token_stream::get((Token *)local_60,&ts);
    if (local_60[0] == '%') {
      local_c0 = primary();
      if ((local_c0 == 0.0) && (!NAN(local_c0))) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_b0,"divide by zero",&local_c9);
        error(&local_b0);
        std::__cxx11::string::~string((string *)&local_b0);
      }
      local_c8 = fmod(local_c8,local_c0);
LAB_00103282:
      bVar1 = true;
    }
    else {
      if (local_60[0] == '/') {
        local_c0 = primary();
        if ((local_c0 == 0.0) && (!NAN(local_c0))) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_b0,"divide by zero",&local_c9);
          error(&local_b0);
          std::__cxx11::string::~string((string *)&local_b0);
        }
        local_c8 = local_c8 / local_c0;
        goto LAB_00103282;
      }
      if (local_60[0] == '*') {
        dVar2 = primary();
        local_c8 = local_c8 * dVar2;
        goto LAB_00103282;
      }
      Token::Token((Token *)local_90,(Token *)local_60);
      Token_stream::unget(&ts,(Token *)local_90);
      std::__cxx11::string::~string((string *)(local_90 + 0x10));
      bVar1 = false;
      local_b8 = local_c8;
    }
    std::__cxx11::string::~string((string *)(local_60 + 0x10));
    if (!bVar1) {
      return local_b8;
    }
  } while( true );
}

Assistant:

double term()
{
	double left = primary();
	while (true)
	{
		Token t = ts.get();
		switch (t.kind)
		{
		case '*':
			left *= primary();
			break;
		case '/':
		{
			double d = primary();
			if (d == 0) error("divide by zero");
			left /= d;
			break;
		}
		case '%':
		{
			auto d = primary();
			if (d == 0)
				error("divide by zero");
			left = fmod(left, d);
			break;
		}
		default:
			ts.unget(t);
			return left;
		}
	}
}